

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
GetQueryParameterFromUri
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,char *uri,string *key)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  runtime_error *this;
  evkeyvalq *peVar5;
  long in_FS_OFFSET;
  evkeyvalq params_q;
  
  peVar5 = &params_q;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = evhttp_uri_parse(uri);
  if (lVar3 == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"URI parsing failed, it likely contained RFC 3986 invalid characters");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    lVar4 = evhttp_uri_get_query(lVar3);
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    if (lVar4 != 0) {
      evhttp_parse_query_str(lVar4,&params_q);
      do {
        peVar5 = *(evkeyvalq **)peVar5;
        if (peVar5 == (evkeyvalq *)0x0) goto LAB_006ce6c5;
        bVar2 = std::operator==(key,*(char **)((long)peVar5 + 0x10));
      } while (!bVar2);
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)__return_storage_ptr__,
                 (char **)((long)peVar5 + 0x18));
LAB_006ce6c5:
      evhttp_clear_headers(&params_q);
    }
    evhttp_uri_free(lVar3);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> GetQueryParameterFromUri(const char* uri, const std::string& key)
{
    evhttp_uri* uri_parsed{evhttp_uri_parse(uri)};
    if (!uri_parsed) {
        throw std::runtime_error("URI parsing failed, it likely contained RFC 3986 invalid characters");
    }
    const char* query{evhttp_uri_get_query(uri_parsed)};
    std::optional<std::string> result;

    if (query) {
        // Parse the query string into a key-value queue and iterate over it
        struct evkeyvalq params_q;
        evhttp_parse_query_str(query, &params_q);

        for (struct evkeyval* param{params_q.tqh_first}; param != nullptr; param = param->next.tqe_next) {
            if (param->key == key) {
                result = param->value;
                break;
            }
        }
        evhttp_clear_headers(&params_q);
    }
    evhttp_uri_free(uri_parsed);

    return result;
}